

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mustache.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
kainjow::mustache::trim<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,mustache *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *s)

{
  char *pcVar1;
  int iVar2;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __tmp;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  long lVar6;
  
  pcVar4 = *(char **)this;
  lVar6 = *(long *)(this + 8);
  pcVar1 = pcVar4 + lVar6;
  pcVar5 = pcVar4;
  while ((lVar6 != 0 && (iVar2 = isspace((int)*pcVar4), pcVar5 = pcVar4, iVar2 != 0))) {
    pcVar4 = pcVar4 + 1;
    lVar6 = lVar6 + -1;
    pcVar5 = pcVar1;
  }
  do {
    pcVar3 = pcVar1;
    pcVar4 = pcVar5;
    if (pcVar3 == pcVar5) break;
    iVar2 = isspace((int)pcVar3[-1]);
    pcVar1 = pcVar3 + -1;
    pcVar4 = pcVar3;
  } while (iVar2 != 0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
            ((string *)__return_storage_ptr__,pcVar5,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

string_type trim(const string_type& s) {
    auto it = s.begin();
    while (it != s.end() && std::isspace(*it)) {
        it++;
    }
    auto rit = s.rbegin();
    while (rit.base() != it && std::isspace(*rit)) {
        rit++;
    }
    return {it, rit.base()};
}